

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.hpp
# Opt level: O3

tuple<std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_> *
__thiscall
njoy::ENDFtk::record::Zipper::
unzip<njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (tuple<std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
           *__return_storage_ptr__,Zipper *this,uint64_t nEntries,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  ReadingPack<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pack;
  uint uVar1;
  ulong uVar2;
  tuple<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
  iterators;
  long *local_80;
  long *local_78;
  tuple<std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
  *local_70;
  ulong local_68;
  Zipper *local_60;
  uint64_t local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Stack_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  undefined4 uStack_40;
  int iStack_3c;
  int local_38;
  undefined4 uStack_34;
  
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
  ).super__Head_base<0UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
  ).super__Head_base<0UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
           ).super__Tuple_impl<1UL,_std::vector<long,_std::allocator<long>_>_>.
           super__Head_base<1UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 0x10) =
       (pointer)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
  ).super__Head_base<0UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
  ).super__Tuple_impl<1UL,_std::vector<long,_std::allocator<long>_>_>.
  super__Head_base<1UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start = 0;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
           ).super__Tuple_impl<1UL,_std::vector<long,_std::allocator<long>_>_>.
           super__Head_base<1UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 8) =
       (pointer)0x0;
  local_70 = __return_storage_ptr__;
  std::vector<long,_std::allocator<long>_>::resize
            ((vector<long,_std::allocator<long>_> *)__return_storage_ptr__,(size_type)this);
  std::vector<long,_std::allocator<long>_>::resize
            (&(__return_storage_ptr__->
              super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
              ).super__Head_base<0UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl,
             (size_type)this);
  local_80 = (__return_storage_ptr__->
             super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
             ).super__Tuple_impl<1UL,_std::vector<long,_std::allocator<long>_>_>.
             super__Head_base<1UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_78 = (__return_storage_ptr__->
             super__Tuple_impl<0UL,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
             ).super__Head_base<0UL,_std::vector<long,_std::allocator<long>_>,_false>._M_head_impl.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_68 = (ulong)this / 3;
  local_60 = this;
  if ((int)local_68 != 0) {
    uVar2 = local_68 & 0xffffffff;
    do {
      iStack_3c = MAT;
      local_38 = MF;
      pack._36_4_ = uStack_34;
      pack.MT = MF;
      pack.MF = MAT;
      pack.MAT = (int)lineNumber;
      pack.end._0_4_ = (int)it;
      pack.it = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)nEntries;
      pack.end._4_4_ = (int)((ulong)it >> 0x20);
      pack.lineNumber = (long *)end;
      local_58 = nEntries;
      p_Stack_50 = it;
      local_48 = end;
      uStack_40 = (int)lineNumber;
      process<njoy::ENDFtk::record::Zipper::Zipped<njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,long,long,long,long,long,long>
                (pack,local_78,local_80,local_78 + 1,local_80 + 1,local_78 + 2,local_80 + 2);
      local_80 = local_80 + 3;
      local_78 = local_78 + 3;
      uVar1 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != 0);
  }
  if (local_60 + local_68 * -3 != (Zipper *)0x0) {
    readPartialLine<njoy::ENDFtk::record::Zipper::Zipped<njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>,std::tuple<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,0ul,1ul>
              (local_60 + local_68 * -3,&local_80,nEntries,it,end,(ulong)lineNumber & 0xffffffff,MAT
               ,MF);
  }
  return local_70;
}

Assistant:

static std::tuple< std::vector< typename ENDFTypes::Type >... >
unzip
( uint64_t nEntries,
  Iterator& it, const Iterator& end, long& lineNumber,
  int MAT, int MF, int MT ){
    
  std::tuple< std::vector< typename ENDFTypes::Type >... > result;    
  reserve( nEntries, result );

  using Zip = Zipped< ENDFTypes... >;
  auto iterators = makeIteratorTuple( result, Zip::tupleIndices );

  int remainingLines = nEntries / Zip::tuplesPerRecord;
  while ( remainingLines-- ){
    readLine< Zip >( iterators, it, end, lineNumber, MAT, MF, MT );
    increment< Zip >( iterators );
  }
    
  const int remainingEntries = nEntries % Zip::tuplesPerRecord;
  if ( remainingEntries ){
    readPartialLine< Zip >
      ( remainingEntries, iterators, it, end, lineNumber,
        MAT, MF, MT, Zip::tupleIndices );
  }
    
  return result;
}